

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void box3_subdivide(box3_t bbox,box3_t *out)

{
  float fVar1;
  undefined8 uVar2;
  box3_t bVar3;
  undefined1 auVar4 [16];
  long lVar5;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar7;
  float fVar8;
  vec3_t vVar9;
  vec3_t vVar10;
  vec3_t vVar11;
  vec3_t b;
  vec3_t b_00;
  vec3_t ps [2];
  undefined1 local_88 [16];
  vec3_t vs [8];
  
  bVar3 = bbox;
  ps[0].z = bbox.min.z;
  ps[0].x = bbox.min.x;
  ps[0].y = bbox.min.y;
  ps[1].x = bbox.max.x;
  ps[1].y = bbox.max.y;
  ps[1].z = bbox.max.z;
  for (lVar5 = 8; lVar5 != 0x68; lVar5 = lVar5 + 0xc) {
    fVar6 = ps[*(int *)((long)&cube_table[0].x + lVar5)].z;
    *(ulong *)(local_88 + lVar5 + 8) =
         CONCAT44(ps[*(int *)(&UNK_0010707c + lVar5)].y,ps[*(int *)(&UNK_00107078 + lVar5)].x);
    *(float *)((long)&vs[0].x + lVar5) = fVar6;
  }
  fVar7 = (bVar3.max.x + bVar3.min.x) * 0.5;
  fVar8 = (bVar3.max.y + bVar3.min.y) * 0.5;
  fVar6 = (bbox.max.z + bbox.min.z) * 0.5;
  for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 0xc) {
    uVar2 = *(undefined8 *)((long)&vs[0].x + lVar5);
    fVar1 = *(float *)((long)&vs[0].z + lVar5);
    vVar9.y = fVar8;
    vVar9.x = fVar7;
    vVar9.z = fVar6;
    vVar11.z = fVar1;
    vVar11.x = (float)(int)uVar2;
    vVar11.y = (float)(int)((ulong)uVar2 >> 0x20);
    vVar9 = vec3_min(vVar9,vVar11);
    vVar10.y = fVar8;
    vVar10.x = fVar7;
    vVar10.z = fVar6;
    b.z = fVar1;
    b.x = (float)(int)uVar2;
    b.y = (float)(int)((ulong)uVar2 >> 0x20);
    vVar10 = vec3_max(vVar10,b);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = vVar10._0_8_;
    local_88._12_4_ = extraout_XMM0_Dd;
    vVar11 = vec3_min(vVar9,vVar10);
    auVar4 = local_88;
    b_00.z = vVar10.z;
    b_00.x = (float)local_88._0_4_;
    b_00.y = (float)local_88._4_4_;
    local_88 = auVar4;
    vVar9 = vec3_max(vVar9,b_00);
    *(long *)((long)&(out->min).x + lVar5 * 2) = vVar11._0_8_;
    *(float *)((long)&(out->min).z + lVar5 * 2) = vVar11.z;
    *(long *)((long)&(out->max).x + lVar5 * 2) = vVar9._0_8_;
    *(float *)((long)&(out->max).z + lVar5 * 2) = vVar9.z;
  }
  return;
}

Assistant:

void
box3_subdivide(box3_t bbox, box3_t out[3]) {
    vec3_t  ps[2] = { bbox.min, bbox.max };

    vec3_t  vs[8];
    for( uint32_t i = 0; i < 8; ++i ) {
        vs[i] = vec3(ps[cube_table[i].x].x, ps[cube_table[i].y].y, ps[cube_table[i].z].z);
    }

    vec3_t  center = box3_center(bbox);

    for( uint32_t i = 0; i < 8; ++i ) {
        out[i] = box3(vec3_min(center, vs[i]), vec3_max(center, vs[i]));
    }
}